

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathContextSetCache(xmlXPathContextPtr ctxt,int active,int value,int options)

{
  xmlXPathContextCachePtr cache;
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  
  iVar3 = -1;
  if (ctxt != (xmlXPathContextPtr)0x0) {
    cache = (xmlXPathContextCachePtr)ctxt->cache;
    if (active == 0) {
      iVar3 = 0;
      if (cache != (xmlXPathContextCachePtr)0x0) {
        xmlXPathFreeCache(cache);
        ctxt->cache = (void *)0x0;
      }
    }
    else {
      if (cache == (xmlXPathContextCachePtr)0x0) {
        puVar2 = (undefined8 *)(*xmlMalloc)(0x20);
        if (puVar2 == (undefined8 *)0x0) {
          puVar2 = (undefined8 *)0x0;
        }
        else {
          puVar2[2] = 0;
          puVar2[3] = 0;
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined4 *)((long)puVar2 + 0x14) = 100;
          *(undefined4 *)((long)puVar2 + 0x1c) = 100;
        }
        ctxt->cache = puVar2;
        if (puVar2 == (undefined8 *)0x0) {
          xmlRaiseMemoryError(ctxt->error,(xmlGenericErrorFunc)0x0,ctxt->userData,0xc,
                              &ctxt->lastError);
          return -1;
        }
      }
      iVar3 = 0;
      if (options == 0) {
        pvVar1 = ctxt->cache;
        iVar3 = 100;
        if (-1 < value) {
          iVar3 = value;
        }
        *(int *)((long)pvVar1 + 0x14) = iVar3;
        *(int *)((long)pvVar1 + 0x1c) = iVar3;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlXPathContextSetCache(xmlXPathContextPtr ctxt,
			int active,
			int value,
			int options)
{
    if (ctxt == NULL)
	return(-1);
    if (active) {
	xmlXPathContextCachePtr cache;

	if (ctxt->cache == NULL) {
	    ctxt->cache = xmlXPathNewCache();
	    if (ctxt->cache == NULL) {
                xmlXPathErrMemory(ctxt);
		return(-1);
            }
	}
	cache = (xmlXPathContextCachePtr) ctxt->cache;
	if (options == 0) {
	    if (value < 0)
		value = 100;
	    cache->maxNodeset = value;
	    cache->maxMisc = value;
	}
    } else if (ctxt->cache != NULL) {
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
	ctxt->cache = NULL;
    }
    return(0);
}